

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmconsol.h
# Opt level: O2

void __thiscall CVmFormatter::push_color(CVmFormatter *this)

{
  os_color_t oVar1;
  undefined4 uVar2;
  size_t sVar3;
  
  sVar3 = this->color_sp_;
  if (sVar3 == 0x19) {
    memmove(this->color_stack_,this->color_stack_ + 1,0x240);
    sVar3 = 0x18;
  }
  this->color_sp_ = sVar3 + 1;
  uVar2 = *(undefined4 *)&(this->cur_color_).field_0x14;
  this->color_stack_[sVar3].attr = (this->cur_color_).attr;
  *(undefined4 *)&this->color_stack_[sVar3].field_0x14 = uVar2;
  oVar1 = (this->cur_color_).bg;
  this->color_stack_[sVar3].fg = (this->cur_color_).fg;
  this->color_stack_[sVar3].bg = oVar1;
  return;
}

Assistant:

void push_color()
    {
        /* 
         *   add a level to the color stack, if possible; if it's not
         *   possible, assume we've lost an end tag somewhere, so rotate the
         *   entire stack down a level 
         */
        if (color_sp_ == CVFMT_CLRSTK_MAX)
        {
            /* take everything down a level */
            memmove(color_stack_, color_stack_ + 1,
                    (CVFMT_CLRSTK_MAX - 1)*sizeof(color_stack_[0]));
            --color_sp_;
        }

        /* save the current color in the stack */
        color_stack_[color_sp_++] = cur_color_;
    }